

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetAlternateToleranceResolution
          (ON_Annotation *this,ON_DimStyle *parent_style,int value)

{
  int iVar1;
  ON_DimStyle *pOVar2;
  ON_DimStyle *override_style;
  bool bCreate;
  int value_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  iVar1 = ON_DimStyle::AlternateToleranceResolution(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,value != iVar1);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetAlternateToleranceResolution(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,AltToleranceResolution,value != iVar1);
  }
  return;
}

Assistant:

void ON_Annotation::SetAlternateToleranceResolution(const ON_DimStyle* parent_style, int value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->AlternateToleranceResolution());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetAlternateToleranceResolution(value);
    override_style->SetFieldOverride(ON_DimStyle::field::AltToleranceResolution, bCreate);
  }
}